

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

int Imf_3_4::levelSize(int min,int max,int l,LevelRoundingMode rmode)

{
  ArgExc *this;
  int *piVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int size;
  int b;
  int a;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  
  if (in_EDX < 0) {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this,"Argument not in valid range.");
    __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  local_20 = (in_ESI - in_EDI) + 1;
  local_24 = 1 << ((byte)in_EDX & 0x1f);
  local_28 = local_20 / local_24;
  if ((in_ECX == 1) && (local_28 * local_24 < local_20)) {
    local_28 = local_28 + 1;
  }
  local_2c = 1;
  piVar1 = std::max<int>(&local_28,&local_2c);
  return *piVar1;
}

Assistant:

int
levelSize (int min, int max, int l, LevelRoundingMode rmode)
{
    if (l < 0) throw IEX_NAMESPACE::ArgExc ("Argument not in valid range.");

    int a    = max - min + 1;
    int b    = (1 << l);
    int size = a / b;

    if (rmode == ROUND_UP && size * b < a) size += 1;

    return std::max (size, 1);
}